

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

bool vkt::api::anon_unknown_0::executeCommandBuffer
               (VkDevice device,DeviceInterface *vk,VkQueue queue,VkCommandBuffer commandBuffer,
               bool exitBeforeEndCommandBuffer)

{
  RefData<vk::Handle<(vk::HandleType)10>_> data;
  RefData<vk::Handle<(vk::HandleType)6>_> data_00;
  VkCommandBuffer pVVar1;
  VkQueue pVVar2;
  DeviceInterface *pDVar3;
  VkResult VVar4;
  int iVar5;
  Handle<(vk::HandleType)10> *pHVar6;
  Handle<(vk::HandleType)6> *pHVar7;
  VkResult result;
  undefined8 uStack_188;
  VkSubmitInfo submitInfo;
  RefData<vk::Handle<(vk::HandleType)6>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  undefined4 uStack_c8;
  VkPipelineStageFlags stageMask;
  VkCommandBufferBeginInfo commandBufferBeginInfo;
  Move<vk::Handle<(vk::HandleType)10>_> local_98;
  RefData<vk::Handle<(vk::HandleType)10>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkCommandBuffer pVStack_30;
  bool exitBeforeEndCommandBuffer_local;
  VkCommandBuffer commandBuffer_local;
  VkQueue queue_local;
  DeviceInterface *vk_local;
  VkDevice device_local;
  
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._7_1_ =
       exitBeforeEndCommandBuffer;
  pVStack_30 = commandBuffer;
  commandBuffer_local = (VkCommandBuffer)queue;
  queue_local = (VkQueue)vk;
  vk_local = (DeviceInterface *)device;
  ::vk::createEvent(&local_98,vk,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_98);
  commandBufferBeginInfo.pNext = (void *)0x0;
  commandBufferBeginInfo.flags = 0;
  commandBufferBeginInfo._20_4_ = 0;
  uStack_c8 = 0x2a;
  stageMask = 0;
  commandBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  commandBufferBeginInfo._4_4_ = 0;
  VVar4 = (**(code **)(*(long *)queue_local + 0x248))(queue_local,pVStack_30,&uStack_c8);
  ::vk::checkResult(VVar4,"vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x260);
  pVVar2 = queue_local;
  pVVar1 = pVStack_30;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_58);
  (**(code **)(*(long *)pVVar2 + 0x350))(pVVar2,pVVar1,pHVar6->m_internal,0x10000);
  if ((event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._7_1_ & 1) ==
      0) {
    VVar4 = (**(code **)(*(long *)queue_local + 0x250))(queue_local,pVStack_30);
    ::vk::checkResult(VVar4,"vk.endCommandBuffer(commandBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x267);
    ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores,
                      (DeviceInterface *)queue_local,(VkDevice)vk_local,0,
                      (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_120,(Move *)&submitInfo.pSignalSemaphores);
    data_00.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
    data_00.object.m_internal = local_120.object.m_internal;
    data_00.deleter.m_device = local_120.deleter.m_device;
    data_00.deleter.m_allocator = local_120.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_100,data_00);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores);
    pVVar2 = queue_local;
    pVVar1 = commandBuffer_local;
    submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
    submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfo.pNext = (void *)0x0;
    submitInfo.waitSemaphoreCount = 0;
    submitInfo._20_4_ = 0;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    submitInfo.signalSemaphoreCount = 0;
    submitInfo._60_4_ = 0;
    uStack_188 = 4;
    submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
    submitInfo._40_8_ = &stack0xffffffffffffffd0;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_100);
    VVar4 = (**(code **)(*(long *)pVVar2 + 0x10))(pVVar2,pVVar1,1,&uStack_188,pHVar7->m_internal);
    ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x279);
    pDVar3 = vk_local;
    pVVar2 = queue_local;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                       ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_100);
    VVar4 = (**(code **)(*(long *)pVVar2 + 0xb0))(pVVar2,pDVar3,1,pHVar7,0,0xffffffffffffffff);
    ::vk::checkResult(VVar4,"vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x27b);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_100);
    pDVar3 = vk_local;
    pVVar2 = queue_local;
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_58);
    iVar5 = (**(code **)(*(long *)pVVar2 + 0xd8))(pVVar2,pDVar3,pHVar6->m_internal);
    device_local._7_1_ = iVar5 == 3;
  }
  else {
    device_local._7_1_ =
         event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._7_1_ & 1;
  }
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_ = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_58);
  return (bool)(device_local._7_1_ & 1);
}

Assistant:

bool executeCommandBuffer (const VkDevice			device,
						   const DeviceInterface&	vk,
						   const VkQueue			queue,
						   const VkCommandBuffer	commandBuffer,
						   const bool				exitBeforeEndCommandBuffer = false)
{
	const Unique<VkEvent>			event					(createEvent(vk, device));
	const VkCommandBufferBeginInfo	commandBufferBeginInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//VkStructureType						sType;
		DE_NULL,										//const void*							pNext;
		0u,												//VkCommandBufferUsageFlags				flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL	//const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};

	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &commandBufferBeginInfo));
	{
		const VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;
		vk.cmdSetEvent(commandBuffer, *event, stageMask);
		if (exitBeforeEndCommandBuffer)
			return exitBeforeEndCommandBuffer;
	}
	VK_CHECK(vk.endCommandBuffer(commandBuffer));

	{
		const Unique<VkFence>					fence			(createFence(vk, device));
		const VkSubmitInfo						submitInfo		=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,	// pWaitDstStageMask
			1u,										// commandBufferCount
			&commandBuffer,							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL									// pSignalSemaphores
		};

		// Submit the command buffer to the queue
		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		// wait for end of execution of queue
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), 0u, INFINITE_TIMEOUT));
	}
	// check if buffer has been executed
	const VkResult result = vk.getEventStatus(device, *event);
	return result == VK_EVENT_SET;
}